

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_fdcf05::EvaluateSplitConfigGenex
          (string *__return_storage_ptr__,anon_unknown_dwarf_fdcf05 *this,string_view input,
          cmGeneratorExpression *ge,cmLocalGenerator *lg,bool useOutputConfig,string *outputConfig,
          string *commandConfig,cmGeneratorTarget *target,
          set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
          *utils)

{
  string_view str;
  ulong uVar1;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  pointer pcVar6;
  string *psVar7;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *this_00;
  reference ppcVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  string_view sVar11;
  undefined7 in_stack_00000009;
  _Base_ptr local_2b8;
  undefined1 local_220 [56];
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_1e8;
  cmGeneratorTarget *local_1b0;
  cmGeneratorTarget *gt;
  iterator __end3;
  iterator __begin3;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *__range3;
  undefined1 local_188 [7];
  bool cross;
  allocator<char> local_161;
  string local_160 [32];
  undefined1 local_140 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  _Base_ptr local_d0;
  string *config;
  undefined1 auStack_b8 [8];
  string_view genex;
  string_view cur;
  size_t nestingLevel;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  ulong local_40;
  size_type pos;
  cmLocalGenerator *pcStack_30;
  bool useOutputConfig_local;
  cmLocalGenerator *lg_local;
  cmGeneratorExpression *ge_local;
  string_view input_local;
  string *result;
  
  lg_local = (cmLocalGenerator *)input._M_str;
  input_local._M_len = input._M_len;
  pos._7_1_ = (byte)lg & 1;
  pos._6_1_ = 0;
  pcStack_30 = (cmLocalGenerator *)ge;
  ge_local = (cmGeneratorExpression *)this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::find
                         ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local,"$<",0);
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local,0,local_40);
    local_50 = bVar9;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_50);
    if (local_40 == 0xffffffffffffffff) break;
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local,local_40,
                       0xffffffffffffffff);
    cur._M_str = (char *)0x1;
    local_40 = 2;
    while( true ) {
      uVar1 = local_40;
      input_local._M_len = (size_t)bVar9._M_str;
      ge_local = (cmGeneratorExpression *)bVar9._M_len;
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local);
      if (sVar5 <= uVar1) break;
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local,local_40,
                         0xffffffffffffffff);
      bVar3 = cmHasLiteralPrefix<3ul>(bVar9,(char (*) [3])0xd70d0c);
      if (bVar3) {
        cur._M_str = cur._M_str + 1;
        local_40 = local_40 + 1;
      }
      else {
        genex._M_str = (char *)bVar9._M_len;
        bVar3 = cmHasLiteralPrefix<2ul>(bVar9,(char (*) [2])0xd17249);
        if ((bVar3) && (cur._M_str = cur._M_str + -1, cur._M_str == (char *)0x0)) {
          local_40 = local_40 + 1;
          break;
        }
      }
      bVar9._M_str = (char *)input_local._M_len;
      bVar9._M_len = (size_t)ge_local;
      local_40 = local_40 + 1;
    }
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local,0,local_40);
    genex._M_len = (size_t)bVar9._M_str;
    auStack_b8 = (undefined1  [8])bVar9._M_len;
    bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&ge_local,local_40,
                        0xffffffffffffffff);
    input_local._M_len = (size_t)bVar10._M_str;
    ge_local = (cmGeneratorExpression *)bVar10._M_len;
    if ((pos._7_1_ & 1) == 0) {
      local_2b8 = (_Base_ptr)outputConfig;
    }
    else {
      local_2b8 = (_Base_ptr)CONCAT71(in_stack_00000009,useOutputConfig);
    }
    local_d0 = local_2b8;
    if (cur._M_str == (char *)0x0) {
      if ((anonymous_namespace)::
          EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
          ::COMMAND_CONFIG == '\0') {
        iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                                     ::COMMAND_CONFIG);
        bVar10._M_str = (char *)input_local._M_len;
        bVar10._M_len = (size_t)ge_local;
        if (iVar4 != 0) {
          sVar11 = (string_view)::cm::operator____s("$<COMMAND_CONFIG:",0x11);
          EvaluateSplitConfigGenex::COMMAND_CONFIG = sVar11;
          __cxa_guard_release(&(anonymous_namespace)::
                               EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                               ::COMMAND_CONFIG);
          bVar10._M_str = (char *)input_local._M_len;
          bVar10._M_len = (size_t)ge_local;
        }
      }
      input_local._M_len = (size_t)bVar10._M_str;
      ge_local = (cmGeneratorExpression *)bVar10._M_len;
      if ((anonymous_namespace)::
          EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
          ::OUTPUT_CONFIG == '\0') {
        iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                                     ::OUTPUT_CONFIG);
        bVar10._M_str = (char *)input_local._M_len;
        bVar10._M_len = (size_t)ge_local;
        if (iVar4 != 0) {
          sVar11 = (string_view)::cm::operator____s("$<OUTPUT_CONFIG:",0x10);
          EvaluateSplitConfigGenex::OUTPUT_CONFIG = sVar11;
          __cxa_guard_release(&(anonymous_namespace)::
                               EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                               ::OUTPUT_CONFIG);
          bVar10._M_str = (char *)input_local._M_len;
          bVar10._M_len = (size_t)ge_local;
        }
      }
      input_local._M_len = (size_t)bVar10._M_str;
      ge_local = (cmGeneratorExpression *)bVar10._M_len;
      sVar11._M_str = (char *)genex._M_len;
      sVar11._M_len = (size_t)auStack_b8;
      bVar3 = cmHasPrefix(sVar11,EvaluateSplitConfigGenex::COMMAND_CONFIG);
      if (bVar3) {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          (&EvaluateSplitConfigGenex::COMMAND_CONFIG);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,sVar5);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,1);
        pos._7_1_ = 0;
        local_d0 = (_Base_ptr)outputConfig;
      }
      else {
        _cge = EvaluateSplitConfigGenex::OUTPUT_CONFIG;
        str._M_str = (char *)genex._M_len;
        str._M_len = (size_t)auStack_b8;
        bVar3 = cmHasPrefix(str,EvaluateSplitConfigGenex::OUTPUT_CONFIG);
        if (bVar3) {
          sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            (&EvaluateSplitConfigGenex::OUTPUT_CONFIG);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,sVar5);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,1);
          pos._7_1_ = 1;
          local_d0 = (_Base_ptr)CONCAT71(in_stack_00000009,useOutputConfig);
        }
      }
      bVar10._M_str = (char *)input_local._M_len;
      bVar10._M_len = (size_t)ge_local;
    }
    pcVar2 = lg_local;
    input_local._M_len = (size_t)bVar10._M_str;
    ge_local = (cmGeneratorExpression *)bVar10._M_len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_160,(basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,&local_161);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(string *)pcVar2);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    pcVar6 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_140);
    pcVar2 = pcStack_30;
    std::__cxx11::string::string((string *)local_188);
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar6,pcVar2,(string *)local_d0,(cmGeneratorTarget *)commandConfig,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                        (string *)local_188);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
    std::__cxx11::string::~string((string *)local_188);
    if (target != (cmGeneratorTarget *)0x0) {
      __range3._7_1_ = ~pos._7_1_ & 1;
      pcVar6 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)local_140);
      this_00 = cmCompiledGeneratorExpression::GetTargets(pcVar6);
      __end3 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::begin(this_00);
      gt = (cmGeneratorTarget *)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::end(this_00);
      while( true ) {
        bVar3 = std::operator!=(&__end3,(_Self *)&gt);
        if (!bVar3) break;
        ppcVar8 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&__end3);
        local_1b0 = *ppcVar8;
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_1b0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                    *)(local_220 + 0x10),psVar7,(bool *)((long)&__range3 + 7));
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      *)local_140);
        cmCompiledGeneratorExpression::GetBacktrace((cmCompiledGeneratorExpression *)local_220);
        BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
        ::BT(&local_1e8,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)(local_220 + 0x10),(cmListFileBacktrace *)local_220);
        std::
        set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
        ::emplace<BT<std::pair<std::__cxx11::string,bool>>>
                  ((set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
                    *)target,&local_1e8);
        BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
        ::~BT(&local_1e8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_220);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                 *)(local_220 + 0x10));
        std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&__end3);
      }
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateSplitConfigGenex(
  cm::string_view input, cmGeneratorExpression const& ge, cmLocalGenerator* lg,
  bool useOutputConfig, std::string const& outputConfig,
  std::string const& commandConfig, cmGeneratorTarget const* target,
  std::set<BT<std::pair<std::string, bool>>>* utils = nullptr)
{
  std::string result;

  while (!input.empty()) {
    // Copy non-genex content directly to the result.
    std::string::size_type pos = input.find("$<");
    result += input.substr(0, pos);
    if (pos == std::string::npos) {
      break;
    }
    input = input.substr(pos);

    // Find the balanced end of this regex.
    size_t nestingLevel = 1;
    for (pos = 2; pos < input.size(); ++pos) {
      cm::string_view cur = input.substr(pos);
      if (cmHasLiteralPrefix(cur, "$<")) {
        ++nestingLevel;
        ++pos;
        continue;
      }
      if (cmHasLiteralPrefix(cur, ">")) {
        --nestingLevel;
        if (nestingLevel == 0) {
          ++pos;
          break;
        }
      }
    }

    // Split this genex from following input.
    cm::string_view genex = input.substr(0, pos);
    input = input.substr(pos);

    // Convert an outer COMMAND_CONFIG or OUTPUT_CONFIG to the matching config.
    std::string const* config =
      useOutputConfig ? &outputConfig : &commandConfig;
    if (nestingLevel == 0) {
      static cm::string_view const COMMAND_CONFIG = "$<COMMAND_CONFIG:"_s;
      static cm::string_view const OUTPUT_CONFIG = "$<OUTPUT_CONFIG:"_s;
      if (cmHasPrefix(genex, COMMAND_CONFIG)) {
        genex.remove_prefix(COMMAND_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = false;
        config = &commandConfig;
      } else if (cmHasPrefix(genex, OUTPUT_CONFIG)) {
        genex.remove_prefix(OUTPUT_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = true;
        config = &outputConfig;
      }
    }

    // Evaluate this genex in the selected configuration.
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(std::string(genex));
    result += cge->Evaluate(lg, *config, target);

    // Record targets referenced by the genex.
    if (utils) {
      // Use a cross-dependency if we referenced the command config.
      bool const cross = !useOutputConfig;
      for (cmGeneratorTarget* gt : cge->GetTargets()) {
        utils->emplace(BT<std::pair<std::string, bool>>(
          { gt->GetName(), cross }, cge->GetBacktrace()));
      }
    }
  }

  return result;
}